

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar1;
  string_view name;
  anon_class_16_2_f6f947d7 local_a0;
  VoidPtr local_90;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_88;
  string_view local_80;
  string_view local_60;
  undefined1 local_50 [8];
  string error;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  proto_local = (FileDescriptorProto *)file;
  file_local = (FileDescriptor *)this;
  join_0x00000010_0x00000000_ = FileDescriptor::package(file);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&error.field_2 + 8))
  ;
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_50);
    local_60 = FileDescriptor::package((FileDescriptor *)proto_local);
    name._M_str = local_50;
    name._M_len = (size_t)local_60._M_str;
    bVar1 = anon_unknown_24::IsValidLowerSnakeCaseName
                      ((anon_unknown_24 *)local_60._M_len,name,(string *)local_60._M_len);
    if (!bVar1) {
      local_80 = FileDescriptor::name((FileDescriptor *)proto_local);
      local_a0.file = (FileDescriptor **)&proto_local;
      local_a0.error = (string *)local_50;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_90,&local_a0);
      make_error.invoker_ = p_Stack_88;
      make_error.ptr_.obj = local_90.obj;
      AddError(this,local_80,&proto->super_Message,NAME,make_error);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(const FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  // Ignore empty packages for style checks.
  if (file->package().empty()) {
    return;
  }
  std::string error;
  if (!IsValidLowerSnakeCaseName(file->package(), &error)) {
    AddError(file->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("Package name ", file->package(), " ", error,
                          kNamingStyleOptOutMessage);
    });
  }
}